

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::End(void)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiWindow *window_00;
  
  pIVar1 = GImGui;
  if ((1 < (GImGui->CurrentWindowStack).Size) ||
     ((GImGui->FrameScopePushedImplicitWindow & 1U) == 0)) {
    window_00 = GImGui->CurrentWindow;
    if ((window_00->DC).ColumnsSet != (ImGuiColumnsSet *)0x0) {
      EndColumns();
    }
    PopClipRect();
    if ((window_00->Flags & 0x1000000U) == 0) {
      LogFinish();
    }
    ImVector<ImGuiWindow_*>::pop_back(&pIVar1->CurrentWindowStack);
    if ((window_00->Flags & 0x4000000U) != 0) {
      ImVector<ImGuiPopupRef>::pop_back(&pIVar1->BeginPopupStack);
    }
    CheckStacksSize(window_00,false);
    bVar2 = ImVector<ImGuiWindow_*>::empty(&pIVar1->CurrentWindowStack);
    if (!bVar2) {
      ImVector<ImGuiWindow_*>::back(&pIVar1->CurrentWindowStack);
    }
    SetCurrentWindow(window_00);
  }
  return;
}

Assistant:

void ImGui::End()
{
    ImGuiContext& g = *GImGui;

    if (g.CurrentWindowStack.Size <= 1 && g.FrameScopePushedImplicitWindow)
    {
        IM_ASSERT(g.CurrentWindowStack.Size > 1 && "Calling End() too many times!");
        return; // FIXME-ERRORHANDLING
    }
    IM_ASSERT(g.CurrentWindowStack.Size > 0);

    ImGuiWindow* window = g.CurrentWindow;

    if (window->DC.ColumnsSet != NULL)
        EndColumns();
    PopClipRect();   // Inner window clip rectangle

    // Stop logging
    if (!(window->Flags & ImGuiWindowFlags_ChildWindow))    // FIXME: add more options for scope of logging
        LogFinish();

    // Pop from window stack
    g.CurrentWindowStack.pop_back();
    if (window->Flags & ImGuiWindowFlags_Popup)
        g.BeginPopupStack.pop_back();
    CheckStacksSize(window, false);
    SetCurrentWindow(g.CurrentWindowStack.empty() ? NULL : g.CurrentWindowStack.back());
}